

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * ODDLParser::OpenDDLParser::parseBooleanLiteral(char *in,char *end,Value **boolean)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *__s2;
  Value *this;
  char *pcVar4;
  
  *boolean = (Value *)0x0;
  if (in != end && in != (char *)0x0) {
    pcVar4 = end;
    __s2 = lookForNextToken<char>(in,end);
    pcVar1 = __s2;
    do {
      in = pcVar1;
      bVar2 = isSeparator<char>((ODDLParser *)(ulong)(uint)(int)*in,(char)pcVar4);
      if (in == end) break;
      pcVar1 = in + 1;
    } while (!bVar2);
    iVar3 = strncmp("true",__s2,4);
    if (iVar3 == 0) {
      this = ValueAllocator::allocPrimData(ddl_bool,1);
      *boolean = this;
      bVar2 = true;
    }
    else {
      iVar3 = strncmp("false",__s2,5);
      if (iVar3 != 0) {
        *boolean = (Value *)0x0;
        return in;
      }
      this = ValueAllocator::allocPrimData(ddl_bool,1);
      *boolean = this;
      bVar2 = false;
    }
    Value::setBool(this,bVar2);
  }
  return in;
}

Assistant:

char *OpenDDLParser::parseBooleanLiteral( char *in, char *end, Value **boolean ) {
    *boolean = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    char *start( in );
    size_t len( 0 );
    while( !isSeparator( *in ) && in != end ) {
        ++in;
        ++len;
    }
    ++len;
    int res = ::strncmp( Grammar::BoolTrue, start, strlen( Grammar::BoolTrue ) );
    if( 0 != res ) {
        res = ::strncmp( Grammar::BoolFalse, start, strlen( Grammar::BoolFalse ) );
        if( 0 != res ) {
            *boolean = ddl_nullptr;
            return in;
        }
        *boolean = ValueAllocator::allocPrimData( Value::ddl_bool );
        (*boolean)->setBool( false );
    } else {
        *boolean = ValueAllocator::allocPrimData( Value::ddl_bool );
        (*boolean)->setBool( true );
    }

    return in;
}